

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

int EDCircles::inverse(double **TB,double **InvB,int N)

{
  undefined8 uVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  double **m;
  double **m_00;
  double **m_01;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint noRows;
  uint noColumns;
  uint noColumns_00;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  ulong uVar8;
  
  noRows = N + 1;
  noColumns = N + 2;
  uVar8 = (ulong)noColumns;
  m = AllocateMatrix(noRows,noColumns);
  noColumns_00 = N * 2 + 2;
  m_00 = AllocateMatrix(noRows,noColumns_00);
  m_01 = AllocateMatrix(noRows,noRows);
  if (N < 1) {
    iVar7 = 0;
  }
  else {
    uVar4 = N * 2;
    uVar14 = (ulong)noRows;
    uVar5 = 1;
    do {
      pdVar2 = TB[uVar5];
      pdVar3 = m[uVar5];
      uVar9 = 1;
      do {
        pdVar3[uVar9] = pdVar2[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar14 != uVar9);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar14);
    iVar7 = 0;
    if (0 < N) {
      uVar15 = uVar4 | 1;
      uVar5 = (ulong)uVar15;
      if ((int)noColumns <= (int)uVar15) {
        noColumns = uVar15;
      }
      uVar9 = 1;
      do {
        pdVar2 = m[uVar9];
        pdVar3 = m_00[uVar9];
        uVar6 = 1;
        do {
          pdVar3[uVar6] = pdVar2[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
        pdVar2 = m_00[uVar9];
        memset(pdVar2 + uVar8,0,(ulong)((noColumns - N) - 2) * 8 + 8);
        pdVar2[(long)(N + -1 + (int)uVar9) + 2] = 1.0;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar14);
      if (0 < N) {
        uVar9 = (ulong)noColumns_00;
        uVar6 = 1;
        lVar10 = 0;
        do {
          pdVar2 = m_00[uVar6];
          dVar16 = pdVar2[uVar6];
          dVar17 = ABS(dVar16);
          uVar13 = uVar6 & 0xffffffff;
          uVar12 = uVar6;
          do {
            if (dVar17 < ABS(m_00[uVar12][uVar6])) {
              uVar13 = uVar12 & 0xffffffff;
              dVar17 = ABS(m_00[uVar12][uVar6]);
            }
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
          if (dVar17 < 1e-19) {
            iVar7 = -1;
            goto LAB_00112e70;
          }
          if (uVar6 <= uVar5 && uVar6 != uVar13) {
            pdVar3 = m_00[(int)uVar13];
            uVar13 = 1;
            do {
              uVar1 = *(undefined8 *)((long)pdVar3 + uVar13 * 8 + lVar10);
              *(undefined8 *)((long)pdVar3 + uVar13 * 8 + lVar10) =
                   *(undefined8 *)((long)pdVar2 + uVar13 * 8 + lVar10);
              *(undefined8 *)((long)pdVar2 + uVar13 * 8 + lVar10) = uVar1;
              uVar13 = uVar13 + 1;
            } while (uVar9 != uVar13);
            dVar16 = pdVar2[uVar6];
          }
          lVar11 = (ulong)uVar4 + 2;
          if (uVar6 <= uVar5) {
            do {
              pdVar2[lVar11 + -1] = pdVar2[lVar11 + -1] / dVar16;
              lVar11 = lVar11 + -1;
            } while ((long)uVar6 < lVar11);
          }
          uVar13 = 1;
          do {
            if ((uVar13 != uVar6) && (uVar6 <= uVar5)) {
              pdVar3 = m_00[uVar13];
              dVar16 = pdVar3[uVar6];
              lVar11 = (ulong)uVar4 + 2;
              do {
                pdVar3[lVar11 + -1] = pdVar2[lVar11 + -1] * -dVar16 + pdVar3[lVar11 + -1];
                lVar11 = lVar11 + -1;
              } while ((long)uVar6 < lVar11);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar14);
          uVar6 = uVar6 + 1;
          lVar10 = lVar10 + 8;
          uVar9 = uVar9 - 1;
        } while (uVar6 != uVar14);
        if (0 < N) {
          uVar5 = 1;
          do {
            pdVar2 = InvB[uVar5];
            pdVar3 = m_00[uVar5];
            lVar10 = 0;
            do {
              pdVar2[lVar10 + 1] = pdVar3[uVar8 + lVar10];
              lVar10 = lVar10 + 1;
            } while ((int)(noRows + (int)lVar10) <= (int)uVar4);
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar14);
        }
      }
      iVar7 = 0;
    }
  }
LAB_00112e70:
  DeallocateMatrix(m,noRows);
  DeallocateMatrix(m_00,noRows);
  DeallocateMatrix(m_01,noRows);
  return iVar7;
}

Assistant:

int EDCircles::inverse(double ** TB, double ** InvB, int N)
{
	int k, i, j, p, q;
	double mult;
	double D, temp;
	double maxpivot;
	int npivot;
	double **B = AllocateMatrix(N + 1, N + 2);
	double **A = AllocateMatrix(N + 1, 2 * N + 2);
	double **C = AllocateMatrix(N + 1, N + 1);
	double eps = 10e-20;

	for (k = 1; k <= N; k++)
		for (j = 1; j <= N; j++)
			B[k][j] = TB[k][j];

	for (k = 1; k <= N; k++)
	{
		for (j = 1; j <= N + 1; j++)
			A[k][j] = B[k][j];
		for (j = N + 2; j <= 2 * N + 1; j++)
			A[k][j] = (double)0;
		A[k][k - 1 + N + 2] = (double)1;
	}
	for (k = 1; k <= N; k++)
	{
		maxpivot = fabs((double)A[k][k]);
		npivot = k;
		for (i = k; i <= N; i++)
			if (maxpivot < fabs((double)A[i][k]))
			{
				maxpivot = fabs((double)A[i][k]);
				npivot = i;
			}
		if (maxpivot >= eps)
		{
			if (npivot != k)
				for (j = k; j <= 2 * N + 1; j++)
				{
					temp = A[npivot][j];
					A[npivot][j] = A[k][j];
					A[k][j] = temp;
				};
			D = A[k][k];
			for (j = 2 * N + 1; j >= k; j--)
				A[k][j] = A[k][j] / D;
			for (i = 1; i <= N; i++)
			{
				if (i != k)
				{
					mult = A[i][k];
					for (j = 2 * N + 1; j >= k; j--)
						A[i][j] = A[i][j] - mult * A[k][j];
				}
			}
		}
		else
		{  // printf("\n The matrix may be singular !!") ;

			DeallocateMatrix(B, N + 1);
			DeallocateMatrix(A, N + 1);
			DeallocateMatrix(C, N + 1);

			return (-1);
		} //end-else
	}
	/**   Copia il risultato nella matrice InvB  ***/
	for (k = 1, p = 1; k <= N; k++, p++)
		for (j = N + 2, q = 1; j <= 2 * N + 1; j++, q++)
			InvB[p][q] = A[k][j];

	DeallocateMatrix(B, N + 1);
	DeallocateMatrix(A, N + 1);
	DeallocateMatrix(C, N + 1);

	return (0);
}